

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O2

string * __thiscall
phyr::Timer::getFormattedTime_abi_cxx11_
          (string *__return_storage_ptr__,Timer *this,uint64_t duration)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = duration;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = duration / 1000;
  uVar1 = (uint)SUB162(auVar3 % ZEXT816(0xe10),0);
  formatString<int,int,int>
            (__return_storage_ptr__,"%02d:%02d:%02d",SUB164(auVar2 / ZEXT816(3600000),0),
             uVar1 / 0x3c,uVar1 % 0x3c);
  return __return_storage_ptr__;
}

Assistant:

std::string getFormattedTime(uint64_t duration) const {
        int hh, mm, ss;

        // Extract time components from given duration

        // Convert to seconds
        duration /= 1000;
        hh = duration / 3600; duration %= 3600;
        mm = duration / 60; duration %= 60;
        ss = duration;

        std::string formattedTime = formatString("%02d:%02d:%02d", hh, mm, ss);
        return formattedTime;
    }